

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::RegisterTests
          (ParameterizedTestSuiteInfo<UnsignedShort> *this)

{
  ParamNameGeneratorFunc *pPVar1;
  TestMetaFactoryBase<unsigned_short> *pTVar2;
  char *name;
  _Alloc_hider test_suite_name_00;
  _Alloc_hider value_param;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar8;
  size_type sVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
  *p_Var10;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false> local_198;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  char *local_188;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo> test_info;
  size_type local_170;
  ParamGenerator<unsigned_short> generator;
  string test_suite_name;
  string local_110;
  string param_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  bVar4 = false;
  for (p_Var10 = &((this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      ; p_Var10 !=
        &((this->tests_).
          super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
         super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      ; p_Var10 = p_Var10 + 1) {
    std::
    __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&test_info.
                    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                   ,p_Var10);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar1 = __lhs->name_func;
      local_188 = __lhs->file;
      iVar7 = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_198._M_head_impl =
           (ParamIteratorInterface<unsigned_short> *)CONCAT44(extraout_var,iVar5);
      local_170 = 0;
      while( true ) {
        iVar5 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        param_name._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar5);
        bVar3 = ParamIterator<unsigned_short>::operator!=
                          ((ParamIterator<unsigned_short> *)&local_198,
                           (ParamIterator<unsigned_short> *)&param_name);
        if (param_name._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)param_name._M_dataplus._M_p + 8))();
        }
        if (!bVar3) break;
        Message::Message((Message *)&local_190);
        iVar5 = (*(local_198._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        local_110._M_dataplus._M_p._0_2_ = *(undefined2 *)CONCAT44(extraout_var_01,iVar5);
        local_110._M_string_length = local_170;
        (*pPVar1)(&param_name,(TestParamInfo<unsigned_short> *)&local_110);
        bVar4 = IsValidParamName(&param_name);
        bVar4 = IsTrue(bVar4);
        if (!bVar4) {
          GTestLog::GTestLog((GTestLog *)&local_110,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x23f);
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar8 = std::operator<<(poVar8,"Parameterized test name \'");
          poVar8 = std::operator<<(poVar8,(string *)&param_name);
          poVar8 = std::operator<<(poVar8,"\' is invalid, in ");
          poVar8 = std::operator<<(poVar8,local_188);
          poVar8 = std::operator<<(poVar8," line ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
          std::endl<char,std::char_traits<char>>(poVar8);
          GTestLog::~GTestLog((GTestLog *)&local_110);
        }
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&test_param_names,&param_name);
        bVar4 = IsTrue(sVar9 == 0);
        if (!bVar4) {
          GTestLog::GTestLog((GTestLog *)&local_110,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x244);
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar8 = std::operator<<(poVar8,"Duplicate parameterized test name \'");
          poVar8 = std::operator<<(poVar8,(string *)&param_name);
          poVar8 = std::operator<<(poVar8,"\', in ");
          poVar8 = std::operator<<(poVar8,local_188);
          poVar8 = std::operator<<(poVar8," line ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
          std::endl<char,std::char_traits<char>>(poVar8);
          GTestLog::~GTestLog((GTestLog *)&local_110);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_190._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_190._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_190._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_110,(Message *)&local_190);
        name = (char *)CONCAT62(local_110._M_dataplus._M_p._2_6_,local_110._M_dataplus._M_p._0_2_);
        iVar5 = (*(local_198._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        PrintToString<unsigned_short>(&local_a0,(unsigned_short *)CONCAT44(extraout_var_02,iVar5));
        value_param._M_p = local_a0._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_80,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar5 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        set_up_tc = SuiteApiResolver<UnsignedShort>::GetSetUpCaseOrSuite(local_188,iVar7);
        tear_down_tc = SuiteApiResolver<UnsignedShort>::GetTearDownCaseOrSuite(local_188,iVar7);
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<unsigned_short>,_std::default_delete<testing::internal::TestMetaFactoryBase<unsigned_short>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<unsigned_short>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<unsigned_short>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<unsigned_short>_*,_false>
                 ._M_head_impl;
        iVar6 = (*(local_198._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        iVar6 = (*pTVar2->_vptr_TestMetaFactoryBase[2])
                          (pTVar2,(ulong)*(ushort *)CONCAT44(extraout_var_04,iVar6));
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name,(char *)0x0,value_param._M_p,&local_80,
                   (TypeId)CONCAT44(extraout_var_03,iVar5),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_05,iVar6));
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_190._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_190._M_head_impl + 8))();
        }
        (*(local_198._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        local_170 = local_170 + 1;
        bVar4 = true;
      }
      if (local_198._M_head_impl != (ParamIteratorInterface<unsigned_short> *)0x0) {
        (*(local_198._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_param_names);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  if (!bVar4) {
    iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      (this);
    CodeLocation::CodeLocation(&local_58,&this->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_06,iVar7),&local_58,
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedShort>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if ( !instantiation_name.empty() )
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }